

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdarith.c
# Opt level: O0

boolean decode_mcu(j_decompress_ptr cinfo,JBLOCKROW *MCU_data)

{
  int iVar1;
  jpeg_entropy_decoder *pjVar2;
  int *piVar3;
  JBLOCKROW paJVar4;
  jpeg_component_info *pjVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int *natural_order;
  uint local_58;
  int m;
  int v;
  int k;
  int sign;
  int tbl;
  int ci;
  int blkn;
  uchar *st;
  JBLOCKROW block;
  jpeg_component_info *compptr;
  arith_entropy_ptr_conflict entropy;
  JBLOCKROW *MCU_data_local;
  j_decompress_ptr cinfo_local;
  
  pjVar2 = cinfo->entropy;
  if (cinfo->restart_interval != 0) {
    if (*(int *)((long)&pjVar2[4].start_pass + 4) == 0) {
      process_restart(cinfo);
    }
    *(int *)((long)&pjVar2[4].start_pass + 4) = *(int *)((long)&pjVar2[4].start_pass + 4) + -1;
  }
  if (*(int *)&pjVar2[2].start_pass != -1) {
    piVar3 = cinfo->natural_order;
    for (tbl = 0; tbl < cinfo->blocks_in_MCU; tbl = tbl + 1) {
      paJVar4 = MCU_data[tbl];
      iVar1 = cinfo->MCU_membership[tbl];
      pjVar5 = cinfo->cur_comp_info[iVar1];
      iVar8 = pjVar5->dc_tbl_no;
      _ci = (&pjVar2[4].decode_mcu)[iVar8] +
            *(int *)((long)&pjVar2[3].start_pass + (long)iVar1 * 4 + 4);
      iVar6 = arith_decode(cinfo,(uchar *)_ci);
      if (iVar6 == 0) {
        *(undefined4 *)((long)&pjVar2[3].start_pass + (long)iVar1 * 4 + 4) = 0;
      }
      else {
        iVar6 = arith_decode(cinfo,(uchar *)(_ci + 1));
        _ci = _ci + (long)iVar6 + 2;
        natural_order._4_4_ = arith_decode(cinfo,(uchar *)_ci);
        if (natural_order._4_4_ != 0) {
          _ci = (&pjVar2[4].decode_mcu)[iVar8] + 0x14;
          while (iVar7 = arith_decode(cinfo,(uchar *)_ci), iVar7 != 0) {
            natural_order._4_4_ = natural_order._4_4_ << 1;
            if (natural_order._4_4_ == 0x8000) {
              cinfo->err->msg_code = 0x75;
              (*cinfo->err->emit_message)((j_common_ptr)cinfo,-1);
              *(undefined4 *)&pjVar2[2].start_pass = 0xffffffff;
              return 1;
            }
            _ci = _ci + 1;
          }
        }
        if ((int)natural_order._4_4_ < (int)((1L << (cinfo->arith_dc_L[iVar8] & 0x3f)) >> 1)) {
          *(undefined4 *)((long)&pjVar2[3].start_pass + (long)iVar1 * 4 + 4) = 0;
        }
        else if ((int)((1L << (cinfo->arith_dc_U[iVar8] & 0x3f)) >> 1) < (int)natural_order._4_4_) {
          *(int *)((long)&pjVar2[3].start_pass + (long)iVar1 * 4 + 4) = iVar6 * 4 + 0xc;
        }
        else {
          *(int *)((long)&pjVar2[3].start_pass + (long)iVar1 * 4 + 4) = iVar6 * 4 + 4;
        }
        local_58 = natural_order._4_4_;
        while (natural_order._4_4_ = (int)natural_order._4_4_ >> 1, natural_order._4_4_ != 0) {
          iVar8 = arith_decode(cinfo,(uchar *)(_ci + 0xe));
          if (iVar8 != 0) {
            local_58 = natural_order._4_4_ | local_58;
          }
        }
        local_58 = local_58 + 1;
        if (iVar6 != 0) {
          local_58 = -local_58;
        }
        *(uint *)((long)&pjVar2[2].start_pass + (long)iVar1 * 4 + 4) =
             local_58 + *(int *)((long)&pjVar2[2].start_pass + (long)iVar1 * 4 + 4);
      }
      (*paJVar4)[0] = (JCOEF)*(undefined4 *)((long)&pjVar2[2].start_pass + (long)iVar1 * 4 + 4);
      if (cinfo->lim_Se != 0) {
        iVar1 = pjVar5->ac_tbl_no;
        m = 0;
        do {
          _ci = (&pjVar2[0xc].decode_mcu)[iVar1] + m * 3;
          iVar8 = arith_decode(cinfo,(uchar *)_ci);
          if (iVar8 != 0) break;
          while( true ) {
            m = m + 1;
            iVar8 = arith_decode(cinfo,(uchar *)(_ci + 1));
            if (iVar8 != 0) break;
            _ci = _ci + 3;
            if (cinfo->lim_Se <= m) {
              cinfo->err->msg_code = 0x75;
              (*cinfo->err->emit_message)((j_common_ptr)cinfo,-1);
              *(undefined4 *)&pjVar2[2].start_pass = 0xffffffff;
              return 1;
            }
          }
          iVar8 = arith_decode(cinfo,(uchar *)&pjVar2[0x14].decode_mcu);
          _ci = _ci + 2;
          natural_order._4_4_ = arith_decode(cinfo,(uchar *)_ci);
          if ((natural_order._4_4_ != 0) && (iVar6 = arith_decode(cinfo,(uchar *)_ci), iVar6 != 0))
          {
            natural_order._4_4_ = natural_order._4_4_ << 1;
            iVar6 = 0xd9;
            if (m <= (int)(uint)cinfo->arith_ac_K[iVar1]) {
              iVar6 = 0xbd;
            }
            _ci = (&pjVar2[0xc].decode_mcu)[iVar1] + iVar6;
            while (iVar6 = arith_decode(cinfo,(uchar *)_ci), iVar6 != 0) {
              natural_order._4_4_ = natural_order._4_4_ << 1;
              if (natural_order._4_4_ == 0x8000) {
                cinfo->err->msg_code = 0x75;
                (*cinfo->err->emit_message)((j_common_ptr)cinfo,-1);
                *(undefined4 *)&pjVar2[2].start_pass = 0xffffffff;
                return 1;
              }
              _ci = _ci + 1;
            }
          }
          local_58 = natural_order._4_4_;
          while (natural_order._4_4_ = (int)natural_order._4_4_ >> 1, natural_order._4_4_ != 0) {
            iVar6 = arith_decode(cinfo,(uchar *)(_ci + 0xe));
            if (iVar6 != 0) {
              local_58 = natural_order._4_4_ | local_58;
            }
          }
          local_58._0_2_ = (short)local_58 + 1;
          if (iVar8 != 0) {
            local_58._0_2_ = -(short)local_58;
          }
          (*paJVar4)[piVar3[m]] = (short)local_58;
        } while (m < cinfo->lim_Se);
      }
    }
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
decode_mcu (j_decompress_ptr cinfo, JBLOCKROW *MCU_data)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr) cinfo->entropy;
  jpeg_component_info * compptr;
  JBLOCKROW block;
  unsigned char *st;
  int blkn, ci, tbl, sign, k;
  int v, m;
  const int * natural_order;

  /* Process restart marker if needed */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0)
      process_restart(cinfo);
    entropy->restarts_to_go--;
  }

  if (entropy->ct == -1) return TRUE;	/* if error do nothing */

  natural_order = cinfo->natural_order;

  /* Outer loop handles each block in the MCU */

  for (blkn = 0; blkn < cinfo->blocks_in_MCU; blkn++) {
    block = MCU_data[blkn];
    ci = cinfo->MCU_membership[blkn];
    compptr = cinfo->cur_comp_info[ci];

    /* Sections F.2.4.1 & F.1.4.4.1: Decoding of DC coefficients */

    tbl = compptr->dc_tbl_no;

    /* Table F.4: Point to statistics bin S0 for DC coefficient coding */
    st = entropy->dc_stats[tbl] + entropy->dc_context[ci];

    /* Figure F.19: Decode_DC_DIFF */
    if (arith_decode(cinfo, st) == 0)
      entropy->dc_context[ci] = 0;
    else {
      /* Figure F.21: Decoding nonzero value v */
      /* Figure F.22: Decoding the sign of v */
      sign = arith_decode(cinfo, st + 1);
      st += 2; st += sign;
      /* Figure F.23: Decoding the magnitude category of v */
      if ((m = arith_decode(cinfo, st)) != 0) {
	st = entropy->dc_stats[tbl] + 20;	/* Table F.4: X1 = 20 */
	while (arith_decode(cinfo, st)) {
	  if ((m <<= 1) == 0x8000) {
	    WARNMS(cinfo, JWRN_ARITH_BAD_CODE);
	    entropy->ct = -1;			/* magnitude overflow */
	    return TRUE;
	  }
	  st += 1;
	}
      }
      /* Section F.1.4.4.1.2: Establish dc_context conditioning category */
      if (m < (int) ((1L << cinfo->arith_dc_L[tbl]) >> 1))
	entropy->dc_context[ci] = 0;		   /* zero diff category */
      else if (m > (int) ((1L << cinfo->arith_dc_U[tbl]) >> 1))
	entropy->dc_context[ci] = 12 + (sign * 4); /* large diff category */
      else
	entropy->dc_context[ci] = 4 + (sign * 4);  /* small diff category */
      v = m;
      /* Figure F.24: Decoding the magnitude bit pattern of v */
      st += 14;
      while (m >>= 1)
	if (arith_decode(cinfo, st)) v |= m;
      v += 1; if (sign) v = -v;
      entropy->last_dc_val[ci] += v;
    }

    (*block)[0] = (JCOEF) entropy->last_dc_val[ci];

    /* Sections F.2.4.2 & F.1.4.4.2: Decoding of AC coefficients */

    if (cinfo->lim_Se == 0) continue;
    tbl = compptr->ac_tbl_no;
    k = 0;

    /* Figure F.20: Decode_AC_coefficients */
    do {
      st = entropy->ac_stats[tbl] + 3 * k;
      if (arith_decode(cinfo, st)) break;	/* EOB flag */
      for (;;) {
	k++;
	if (arith_decode(cinfo, st + 1)) break;
	st += 3;
	if (k >= cinfo->lim_Se) {
	  WARNMS(cinfo, JWRN_ARITH_BAD_CODE);
	  entropy->ct = -1;			/* spectral overflow */
	  return TRUE;
	}
      }
      /* Figure F.21: Decoding nonzero value v */
      /* Figure F.22: Decoding the sign of v */
      sign = arith_decode(cinfo, entropy->fixed_bin);
      st += 2;
      /* Figure F.23: Decoding the magnitude category of v */
      if ((m = arith_decode(cinfo, st)) != 0) {
	if (arith_decode(cinfo, st)) {
	  m <<= 1;
	  st = entropy->ac_stats[tbl] +
	       (k <= cinfo->arith_ac_K[tbl] ? 189 : 217);
	  while (arith_decode(cinfo, st)) {
	    if ((m <<= 1) == 0x8000) {
	      WARNMS(cinfo, JWRN_ARITH_BAD_CODE);
	      entropy->ct = -1;			/* magnitude overflow */
	      return TRUE;
	    }
	    st += 1;
	  }
	}
      }
      v = m;
      /* Figure F.24: Decoding the magnitude bit pattern of v */
      st += 14;
      while (m >>= 1)
	if (arith_decode(cinfo, st)) v |= m;
      v += 1; if (sign) v = -v;
      (*block)[natural_order[k]] = (JCOEF) v;
    } while (k < cinfo->lim_Se);
  }

  return TRUE;
}